

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetDataViewStorage(JsValueRef instance,BYTE **buffer,uint *bufferLength)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  DataView *this;
  ArrayBufferBase *pAVar4;
  undefined4 extraout_var;
  DataView *dataView;
  DebugCheckNoException local_30;
  DebugCheckNoException __debugCheckNoException;
  uint *bufferLength_local;
  BYTE **buffer_local;
  JsValueRef instance_local;
  
  if (instance == (JsValueRef)0x0) {
    instance_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (buffer == (BYTE **)0x0) {
    instance_local._4_4_ = JsErrorNullArgument;
  }
  else if (bufferLength == (uint *)0x0) {
    instance_local._4_4_ = JsErrorNullArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)bufferLength;
    DebugCheckNoException::DebugCheckNoException(&local_30);
    bVar1 = Js::VarIs<Js::DataView>(instance);
    if (bVar1) {
      this = Js::VarTo<Js::DataView>(instance);
      pAVar4 = Js::ArrayBufferParent::GetArrayBuffer(&this->super_ArrayBufferParent);
      iVar2 = (*(pAVar4->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
      uVar3 = Js::DataView::GetByteOffset(this);
      *buffer = (BYTE *)(CONCAT44(extraout_var,iVar2) + (ulong)uVar3);
      uVar3 = Js::ArrayObject::GetLength((ArrayObject *)this);
      *(uint32 *)__debugCheckNoException = uVar3;
    }
    else {
      instance_local._4_4_ = JsErrorInvalidArgument;
    }
    local_30.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_30);
    if (bVar1) {
      instance_local._4_4_ = JsNoError;
    }
  }
  return instance_local._4_4_;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetDataViewStorage(_In_ JsValueRef instance, _Outptr_result_bytebuffer_(*bufferLength) BYTE **buffer, _Out_ unsigned int *bufferLength)
{
    VALIDATE_JSREF(instance);
    PARAM_NOT_NULL(buffer);
    PARAM_NOT_NULL(bufferLength);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::DataView>(instance))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        Js::DataView* dataView = Js::VarTo<Js::DataView>(instance);
        *buffer = dataView->GetArrayBuffer()->GetBuffer() + dataView->GetByteOffset();
        *bufferLength = dataView->GetLength();
    }